

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O0

cmLinkInterface * __thiscall
cmGeneratorTarget::GetLinkInterface(cmGeneratorTarget *this,string *config,cmGeneratorTarget *head)

{
  bool bVar1;
  TargetType TVar2;
  pointer ppVar3;
  cmGeneratorTarget *local_60;
  byte local_51;
  cmOptionalLinkInterface *iface;
  _Rb_tree_iterator<std::pair<const_cmGeneratorTarget_*const,_cmOptionalLinkInterface>_> local_38;
  map<const_cmGeneratorTarget_*,_cmOptionalLinkInterface,_std::less<const_cmGeneratorTarget_*>,_std::allocator<std::pair<const_cmGeneratorTarget_*const,_cmOptionalLinkInterface>_>_>
  *local_30;
  cmHeadToLinkInterfaceMap *hm;
  cmGeneratorTarget *head_local;
  string *config_local;
  cmGeneratorTarget *this_local;
  
  hm = (cmHeadToLinkInterfaceMap *)head;
  head_local = (cmGeneratorTarget *)config;
  config_local = (string *)this;
  bVar1 = IsImported(this);
  if (bVar1) {
    this_local = (cmGeneratorTarget *)
                 GetImportLinkInterface(this,(string *)head_local,(cmGeneratorTarget *)hm,false);
  }
  else {
    TVar2 = GetType(this);
    if ((TVar2 != EXECUTABLE) || (bVar1 = IsExecutableWithExports(this), bVar1)) {
      local_30 = &GetHeadToLinkInterfaceMap(this,(string *)head_local)->
                  super_map<const_cmGeneratorTarget_*,_cmOptionalLinkInterface,_std::less<const_cmGeneratorTarget_*>,_std::allocator<std::pair<const_cmGeneratorTarget_*const,_cmOptionalLinkInterface>_>_>
      ;
      bVar1 = std::
              map<const_cmGeneratorTarget_*,_cmOptionalLinkInterface,_std::less<const_cmGeneratorTarget_*>,_std::allocator<std::pair<const_cmGeneratorTarget_*const,_cmOptionalLinkInterface>_>_>
              ::empty(local_30);
      local_51 = 0;
      if (!bVar1) {
        local_38._M_node =
             (_Base_ptr)
             std::
             map<const_cmGeneratorTarget_*,_cmOptionalLinkInterface,_std::less<const_cmGeneratorTarget_*>,_std::allocator<std::pair<const_cmGeneratorTarget_*const,_cmOptionalLinkInterface>_>_>
             ::begin(local_30);
        ppVar3 = std::
                 _Rb_tree_iterator<std::pair<const_cmGeneratorTarget_*const,_cmOptionalLinkInterface>_>
                 ::operator->(&local_38);
        local_51 = (ppVar3->second).super_cmLinkInterface.field_0x6c ^ 0xff;
      }
      if ((local_51 & 1) == 0) {
        local_60 = (cmGeneratorTarget *)
                   std::
                   map<const_cmGeneratorTarget_*,_cmOptionalLinkInterface,_std::less<const_cmGeneratorTarget_*>,_std::allocator<std::pair<const_cmGeneratorTarget_*const,_cmOptionalLinkInterface>_>_>
                   ::operator[](local_30,(key_type *)&hm);
        if (((local_60->CompileInfoMap)._M_t._M_impl.super__Rb_tree_header._M_node_count & 0x100) ==
            0) {
          *(undefined1 *)
           ((long)&(local_60->CompileInfoMap)._M_t._M_impl.super__Rb_tree_header._M_node_count + 1)
               = 1;
          ComputeLinkInterfaceLibraries
                    (this,(string *)head_local,(cmOptionalLinkInterface *)local_60,
                     (cmGeneratorTarget *)hm,false);
        }
        if ((((local_60->CompileInfoMap)._M_t._M_impl.super__Rb_tree_header._M_node_count & 0x10000)
             == 0) &&
           (*(undefined1 *)
             ((long)&(local_60->CompileInfoMap)._M_t._M_impl.super__Rb_tree_header._M_node_count + 2
             ) = 1, ((local_60->CompileInfoMap)._M_t._M_impl.super__Rb_tree_header._M_node_count &
                    0x1000000) != 0)) {
          ComputeLinkInterface
                    (this,(string *)head_local,(cmOptionalLinkInterface *)local_60,
                     (cmGeneratorTarget *)hm);
        }
        if (((local_60->CompileInfoMap)._M_t._M_impl.super__Rb_tree_header._M_node_count & 0x1000000
            ) == 0) {
          local_60 = (cmGeneratorTarget *)0x0;
        }
        this_local = local_60;
      }
      else {
        iface = (cmOptionalLinkInterface *)
                std::
                map<const_cmGeneratorTarget_*,_cmOptionalLinkInterface,_std::less<const_cmGeneratorTarget_*>,_std::allocator<std::pair<const_cmGeneratorTarget_*const,_cmOptionalLinkInterface>_>_>
                ::begin(local_30);
        ppVar3 = std::
                 _Rb_tree_iterator<std::pair<const_cmGeneratorTarget_*const,_cmOptionalLinkInterface>_>
                 ::operator->((_Rb_tree_iterator<std::pair<const_cmGeneratorTarget_*const,_cmOptionalLinkInterface>_>
                               *)&iface);
        this_local = (cmGeneratorTarget *)&ppVar3->second;
      }
    }
    else {
      this_local = (cmGeneratorTarget *)0x0;
    }
  }
  return (cmLinkInterface *)this_local;
}

Assistant:

cmLinkInterface const* cmGeneratorTarget::GetLinkInterface(
  const std::string& config, cmGeneratorTarget const* head) const
{
  // Imported targets have their own link interface.
  if (this->IsImported()) {
    return this->GetImportLinkInterface(config, head, false);
  }

  // Link interfaces are not supported for executables that do not
  // export symbols.
  if (this->GetType() == cmStateEnums::EXECUTABLE &&
      !this->IsExecutableWithExports()) {
    return CM_NULLPTR;
  }

  // Lookup any existing link interface for this configuration.
  cmHeadToLinkInterfaceMap& hm = this->GetHeadToLinkInterfaceMap(config);

  // If the link interface does not depend on the head target
  // then return the one we computed first.
  if (!hm.empty() && !hm.begin()->second.HadHeadSensitiveCondition) {
    return &hm.begin()->second;
  }

  cmOptionalLinkInterface& iface = hm[head];
  if (!iface.LibrariesDone) {
    iface.LibrariesDone = true;
    this->ComputeLinkInterfaceLibraries(config, iface, head, false);
  }
  if (!iface.AllDone) {
    iface.AllDone = true;
    if (iface.Exists) {
      this->ComputeLinkInterface(config, iface, head);
    }
  }

  return iface.Exists ? &iface : CM_NULLPTR;
}